

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heritage.cc
# Opt level: O0

void __thiscall Heritage::propagateCopyAway(Heritage *this,PcodeOp *op)

{
  Funcdata *this_00;
  bool bVar1;
  OpCode OVar2;
  Varnode *pVVar3;
  PcodeOp *this_01;
  Address *this_02;
  Address *op2;
  Varnode *nextIn;
  PcodeOp *nextOp;
  Varnode *inVn;
  PcodeOp *op_local;
  Heritage *this_local;
  
  pVVar3 = PcodeOp::getIn(op,0);
  do {
    nextOp = (PcodeOp *)pVVar3;
    bVar1 = Varnode::isWritten((Varnode *)nextOp);
    if (!bVar1) break;
    this_01 = Varnode::getDef((Varnode *)nextOp);
    OVar2 = PcodeOp::code(this_01);
    if (OVar2 != CPUI_COPY) break;
    pVVar3 = PcodeOp::getIn(this_01,0);
    this_02 = Varnode::getAddr(pVVar3);
    op2 = Varnode::getAddr((Varnode *)nextOp);
    bVar1 = Address::operator!=(this_02,op2);
  } while (!bVar1);
  this_00 = this->fd;
  pVVar3 = PcodeOp::getOut(op);
  Funcdata::totalReplace(this_00,pVVar3,(Varnode *)nextOp);
  Funcdata::opDestroy(this->fd,op);
  return;
}

Assistant:

void Heritage::propagateCopyAway(PcodeOp *op)

{
  Varnode *inVn = op->getIn(0);
  while(inVn->isWritten()) {		// Follow any COPY chain to earliest input
    PcodeOp *nextOp = inVn->getDef();
    if (nextOp->code() != CPUI_COPY) break;
    Varnode *nextIn = nextOp->getIn(0);
    if (nextIn->getAddr() != inVn->getAddr()) break;
    inVn = nextIn;
  }
  fd->totalReplace(op->getOut(),inVn);
  fd->opDestroy(op);
}